

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_muladd_sparc64(float32 xa,float32 xb,float32 xc,int flags,float_status *s)

{
  union_float32 uVar1;
  union_float32 uVar2;
  _Bool _Var3;
  float32 fVar4;
  bool bVar5;
  _Bool local_a2;
  union_float32 uc_orig;
  union_float32 ua_orig;
  float fStack_90;
  _Bool prod_sign;
  union_float32 up;
  union_float32 ur;
  union_float32 uc;
  union_float32 ub;
  union_float32 ua;
  float_status *s_local;
  float32 local_70;
  int flags_local;
  float32 xc_local;
  float32 xb_local;
  float32 xa_local;
  float_status *local_58;
  union_float32 *local_50;
  union_float32 *local_48;
  union_float32 *local_40;
  union_float32 local_34;
  union_float32 local_30;
  union_float32 local_2c;
  union_float32 local_28;
  union_float32 local_24;
  float local_10;
  
  bVar5 = false;
  if ((s->float_exception_flags & 0x20) != 0) {
    bVar5 = s->float_rounding_mode == '\0';
  }
  up.s = xc;
  ur.s = xb;
  uc.s = xa;
  _ub = s;
  s_local._4_4_ = flags;
  local_70 = xc;
  flags_local = xb;
  xc_local = xa;
  _xa_local = s;
  if ((bVar5) && ((flags & 8U) == 0)) {
    local_40 = &uc;
    local_48 = &ur;
    local_50 = &up;
    local_58 = s;
    if (s->flush_inputs_to_zero != '\0') {
      float32_input_flush__nocheck(&local_40->s,s);
      float32_input_flush__nocheck(&local_48->s,local_58);
      float32_input_flush__nocheck(&local_50->s,local_58);
    }
    local_2c = uc;
    local_30 = ur;
    local_34 = up;
    _Var3 = float32_is_zero_or_normal(uc.s);
    local_a2 = false;
    if (_Var3) {
      _Var3 = float32_is_zero_or_normal(local_30.s);
      local_a2 = false;
      if (_Var3) {
        local_a2 = float32_is_zero_or_normal(local_34.s);
      }
    }
    uVar2 = uc;
    uVar1 = up;
    up = uVar1;
    uc = uVar2;
    if ((((local_a2 ^ 0xffU) & 1) == 0) && ((force_soft_fma & 1U) == 0)) {
      local_24 = uc;
      if (((uc.s & 0x7fffffff) == 0) || (local_28 = ur, (ur.s & 0x7fffffff) == 0)) {
        if ((s_local._4_4_ & 1) != 0) {
          up.s = up.s ^ 0x80000000;
        }
        fStack_90 = (float)((uint)((int)(uc.s ^ ur.s) < 0 != ((s_local._4_4_ & 2) != 0)) << 0x1f) +
                    up.h;
      }
      else {
        if ((s_local._4_4_ & 2) != 0) {
          uc.s = uc.s ^ 0x80000000;
        }
        if ((s_local._4_4_ & 1) != 0) {
          up.s = up.s ^ 0x80000000;
        }
        fStack_90 = fmaf(uc.h,ur.h,up.h);
        if (ABS(fStack_90) == INFINITY) {
          _ub->float_exception_flags = _ub->float_exception_flags | 8;
        }
        else {
          up = uVar1;
          uc = uVar2;
          local_10 = fStack_90;
          if (ABS(fStack_90) <= 1.1754944e-38) goto LAB_00e0735e;
        }
      }
      if ((s_local._4_4_ & 4) != 0) {
        return (float32)-fStack_90;
      }
      return (float32)fStack_90;
    }
  }
LAB_00e0735e:
  fVar4 = soft_f32_muladd(uc.s,ur.s,up.s,s_local._4_4_,_ub);
  return fVar4;
}

Assistant:

float32 QEMU_FLATTEN
float32_muladd(float32 xa, float32 xb, float32 xc, int flags, float_status *s)
{
    union_float32 ua, ub, uc, ur;

    ua.s = xa;
    ub.s = xb;
    uc.s = xc;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }
    if (unlikely(flags & float_muladd_halve_result)) {
        goto soft;
    }

    float32_input_flush3(&ua.s, &ub.s, &uc.s, s);
    if (unlikely(!f32_is_zon3(ua, ub, uc))) {
        goto soft;
    }

    if (unlikely(force_soft_fma)) {
        goto soft;
    }

    /*
     * When (a || b) == 0, there's no need to check for under/over flow,
     * since we know the addend is (normal || 0) and the product is 0.
     */
    if (float32_is_zero(ua.s) || float32_is_zero(ub.s)) {
        union_float32 up;
        bool prod_sign;

        prod_sign = float32_is_neg(ua.s) ^ float32_is_neg(ub.s);
        prod_sign ^= !!(flags & float_muladd_negate_product);
        up.s = float32_set_sign(float32_zero, prod_sign);

        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }
        ur.h = up.h + uc.h;
    } else {
        union_float32 ua_orig = ua;
        union_float32 uc_orig = uc;

        if (flags & float_muladd_negate_product) {
            ua.h = -ua.h;
        }
        if (flags & float_muladd_negate_c) {
            uc.h = -uc.h;
        }

        ur.h = fmaf(ua.h, ub.h, uc.h);

        if (unlikely(f32_is_inf(ur))) {
            s->float_exception_flags |= float_flag_overflow;
        } else if (unlikely(fabsf(ur.h) <= FLT_MIN)) {
            ua = ua_orig;
            uc = uc_orig;
            goto soft;
        }
    }
    if (flags & float_muladd_negate_result) {
        return float32_chs(ur.s);
    }
    return ur.s;

 soft:
    return soft_f32_muladd(ua.s, ub.s, uc.s, flags, s);
}